

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_ntop.c
# Opt level: O0

char * sock_ntop(sockaddr *sa,socklen_t salen)

{
  uint16_t uVar1;
  char *pcVar2;
  sockaddr_in6 *sin6;
  sockaddr_in *sin;
  undefined1 local_1d;
  char portstr [8];
  socklen_t salen_local;
  sockaddr *sa_local;
  
  portstr._0_4_ = salen;
  unique0x100001fc = sa;
  if (sa->sa_family == 2) {
    pcVar2 = inet_ntop(2,sa->sa_data + 2,sock_ntop::str,0x80);
    if (pcVar2 == (char *)0x0) {
      sa_local = (sockaddr *)0x0;
    }
    else {
      uVar1 = ntohs(*(uint16_t *)sa->sa_data);
      if (uVar1 != 0) {
        uVar1 = ntohs(*(uint16_t *)sa->sa_data);
        snprintf((char *)((long)&sin + 4),7,":%d",(ulong)uVar1);
        local_1d = 0;
        strcat(sock_ntop::str,(char *)((long)&sin + 4));
      }
      sa_local = (sockaddr *)sock_ntop::str;
    }
  }
  else if (sa->sa_family == 10) {
    sock_ntop::str[0] = '[';
    pcVar2 = inet_ntop(10,sa->sa_data + 6,sock_ntop::str + 1,0x7f);
    if (pcVar2 == (char *)0x0) {
      sa_local = (sockaddr *)0x0;
    }
    else {
      uVar1 = ntohs(*(uint16_t *)sa->sa_data);
      if (uVar1 == 0) {
        sa_local = (sockaddr *)(sock_ntop::str + 1);
      }
      else {
        uVar1 = ntohs(*(uint16_t *)sa->sa_data);
        snprintf((char *)((long)&sin + 4),8,"]:%d",(ulong)uVar1);
        local_1d = 0;
        strcat(sock_ntop::str,(char *)((long)&sin + 4));
        sa_local = (sockaddr *)sock_ntop::str;
      }
    }
  }
  else {
    snprintf(sock_ntop::str,0x7f,"sock_ntop: unknown AF_xxx: %d, len %d",(ulong)sa->sa_family,
             (ulong)salen);
    sock_ntop::str[0x7f] = '\0';
    sa_local = (sockaddr *)sock_ntop::str;
  }
  return (char *)sa_local;
}

Assistant:

char *sock_ntop(const struct sockaddr *sa, socklen_t salen) {
    char portstr[8];
    static char str[128]; /* Unix domain is largest */

    switch (sa->sa_family) {
    case AF_INET: {
        const struct sockaddr_in *sin = (const struct sockaddr_in *)sa;

        if (inet_ntop(AF_INET, &sin->sin_addr, str, sizeof(str)) == NULL)
            return (NULL);
        if (ntohs(sin->sin_port) != 0) {
            snprintf(portstr, sizeof(portstr) - 1, ":%d", ntohs(sin->sin_port));
            portstr[sizeof(portstr) - 1] = '\0';
            strcat(str, portstr);
        }
        return (str);
    }
    /* end sock_ntop */

#ifdef AF_INET6
    case AF_INET6: {
        const struct sockaddr_in6 *sin6 = (const struct sockaddr_in6 *)sa;

        str[0] = '[';
        if (inet_ntop(AF_INET6, &sin6->sin6_addr, str + 1, sizeof(str) - 1) ==
            NULL)
            return (NULL);
        if (ntohs(sin6->sin6_port) != 0) {
            snprintf(portstr, sizeof(portstr), "]:%d", ntohs(sin6->sin6_port));
            portstr[sizeof(portstr) - 1] = '\0';
            strcat(str, portstr);
            return (str);
        }
        return (str + 1);
    }
#endif

    default:
        snprintf(str, sizeof(str) - 1, "sock_ntop: unknown AF_xxx: %d, len %d",
                 sa->sa_family, salen);
        str[sizeof(str) - 1] = '\0';
        return (str);
    }
    return (NULL);
}